

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_call(CPUTriCoreState *env,uint32_t next_pc)

{
  int iVar1;
  uintptr_t unaff_retaddr;
  uint32_t local_24;
  uint local_20;
  target_ulong_conflict psw;
  target_ulong_conflict new_FCX;
  target_ulong_conflict ea;
  target_ulong_conflict tmp_FCX;
  uint32_t next_pc_local;
  CPUTriCoreState *env_local;
  
  ea = next_pc;
  _tmp_FCX = env;
  local_24 = psw_read(env);
  if (_tmp_FCX->FCX == 0) {
    raise_exception_sync_helper(_tmp_FCX,3,4,unaff_retaddr);
  }
  if (((local_24 & 0x80) != 0) && (iVar1 = cdc_increment(&local_24), iVar1 != 0)) {
    raise_exception_sync_helper(_tmp_FCX,3,2,unaff_retaddr);
  }
  local_24 = local_24 | 0x80;
  new_FCX = _tmp_FCX->FCX;
  psw = (_tmp_FCX->FCX & 0xf0000) * 0x1000 + (_tmp_FCX->FCX & 0xffff) * 0x40;
  local_20 = cpu_ldl_data_tricore(_tmp_FCX,psw);
  save_context_upper(_tmp_FCX,psw);
  _tmp_FCX->PCXI = (_tmp_FCX->PCXI & 0xffffff) + _tmp_FCX->ICR * 0x1000000;
  _tmp_FCX->PCXI = (_tmp_FCX->PCXI & 0xff7fffff) + (_tmp_FCX->ICR & 0x100) * 0x8000;
  _tmp_FCX->PCXI = _tmp_FCX->PCXI | 0x400000;
  _tmp_FCX->PCXI = (_tmp_FCX->PCXI & 0xfff00000) + (_tmp_FCX->FCX & 0xfffff);
  _tmp_FCX->FCX = (_tmp_FCX->FCX & 0xfff00000) + (local_20 & 0xfffff);
  _tmp_FCX->gpr_a[0xb] = ea;
  if (new_FCX == _tmp_FCX->LCX) {
    raise_exception_sync_helper(_tmp_FCX,3,1,unaff_retaddr);
  }
  psw_write(_tmp_FCX,local_24);
  return;
}

Assistant:

void helper_call(CPUTriCoreState *env, uint32_t next_pc)
{
    target_ulong tmp_FCX;
    target_ulong ea;
    target_ulong new_FCX;
    target_ulong psw;

    psw = psw_read(env);
    /* if (FCX == 0) trap(FCU); */
    if (env->FCX == 0) {
        /* FCU trap */
        raise_exception_sync_helper(env, TRAPC_CTX_MNG, TIN3_FCU, GETPC());
    }
    /* if (PSW.CDE) then if (cdc_increment()) then trap(CDO); */
    if (psw & MASK_PSW_CDE) {
        if (cdc_increment(&psw)) {
            /* CDO trap */
            raise_exception_sync_helper(env, TRAPC_CTX_MNG, TIN3_CDO, GETPC());
        }
    }
    /* PSW.CDE = 1;*/
    psw |= MASK_PSW_CDE;
    /* tmp_FCX = FCX; */
    tmp_FCX = env->FCX;
    /* EA = {FCX.FCXS, 6'b0, FCX.FCXO, 6'b0}; */
    ea = ((env->FCX & MASK_FCX_FCXS) << 12) +
         ((env->FCX & MASK_FCX_FCXO) << 6);
    /* new_FCX = M(EA, word); */
    new_FCX = cpu_ldl_data(env, ea);
    /* M(EA, 16 * word) = {PCXI, PSW, A[10], A[11], D[8], D[9], D[10], D[11],
                           A[12], A[13], A[14], A[15], D[12], D[13], D[14],
                           D[15]}; */
    save_context_upper(env, ea);

    /* PCXI.PCPN = ICR.CCPN; */
    env->PCXI = (env->PCXI & 0xffffff) +
                ((env->ICR & MASK_ICR_CCPN) << 24);
    /* PCXI.PIE = ICR.IE; */
    env->PCXI = ((env->PCXI & ~MASK_PCXI_PIE_1_3) +
                ((env->ICR & MASK_ICR_IE_1_3) << 15));
    /* PCXI.UL = 1; */
    env->PCXI |= MASK_PCXI_UL;

    /* PCXI[19: 0] = FCX[19: 0]; */
    env->PCXI = (env->PCXI & 0xfff00000) + (env->FCX & 0xfffff);
    /* FCX[19: 0] = new_FCX[19: 0]; */
    env->FCX = (env->FCX & 0xfff00000) + (new_FCX & 0xfffff);
    /* A[11] = next_pc[31: 0]; */
    env->gpr_a[11] = next_pc;

    /* if (tmp_FCX == LCX) trap(FCD);*/
    if (tmp_FCX == env->LCX) {
        /* FCD trap */
        raise_exception_sync_helper(env, TRAPC_CTX_MNG, TIN3_FCD, GETPC());
    }
    psw_write(env, psw);
}